

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

int av1_calc_arf_boost(TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,PRIMARY_RATE_CONTROL *p_rc,
                      FRAME_INFO *frame_info,int offset,int f_frames,int b_frames,
                      int *num_fpstats_used,int *num_fpstats_required,int project_gfu_boost)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  FIRSTPASS_STATS *pFVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  GF_GROUP_STATS local_c8;
  
  local_c8.gf_group_skip_pct = 0.0;
  local_c8.gf_group_inactive_zone_rows = 0.0;
  local_c8.gf_group_err = 0.0;
  local_c8.gf_group_raw_error = 0.0;
  local_c8.mv_ratio_accumulator = 0.0;
  local_c8.decay_accumulator = 1.0;
  local_c8.zero_motion_accumulator = 1.0;
  local_c8.loop_decay_rate = 1.0;
  local_c8.last_loop_decay_rate = 1.0;
  local_c8.this_frame_mv_in_out = 0.0;
  local_c8.mv_in_out_accumulator = 0.0;
  local_c8.abs_mv_in_out_accumulator = 0.0;
  local_c8.avg_sr_coded_error = 0.0;
  local_c8.avg_pcnt_second_ref = 0.0;
  local_c8.avg_new_mv_count = 0.0;
  local_c8.avg_wavelet_energy = 0.0;
  local_c8.avg_raw_err_stdev = 0.0;
  local_c8.non_zero_stdev_count = 0;
  if (num_fpstats_used != (int *)0x0) {
    *num_fpstats_used = 0;
  }
  lVar4 = (long)offset;
  if (f_frames < 1) {
    iVar2 = 100;
  }
  else {
    uVar10 = (ulong)(uint)f_frames;
    lVar8 = lVar4 * 0xe8;
    dVar11 = 100.0;
    lVar5 = lVar4;
    do {
      uVar10 = uVar10 - 1;
      if (((lVar5 < 0) ||
          ((FIRSTPASS_STATS *)((long)&twopass_frame->stats_in->frame + lVar8) <
           twopass->stats_buf_ctx->stats_in_end)) &&
         ((-1 < lVar5 ||
          (twopass->stats_buf_ctx->stats_in_start <=
           (FIRSTPASS_STATS *)((long)&twopass_frame->stats_in->frame + lVar8))))) {
        pFVar7 = (FIRSTPASS_STATS *)((long)&twopass_frame->stats_in->frame + lVar8);
      }
      else {
        pFVar7 = (FIRSTPASS_STATS *)0x0;
      }
      if (pFVar7 != (FIRSTPASS_STATS *)0x0) {
        dVar12 = (double)frame_info->frame_height;
        accumulate_frame_motion_stats(pFVar7,&local_c8,(double)frame_info->frame_width,dVar12);
        iVar2 = detect_flash(twopass,twopass_frame,(int)lVar5);
        if ((iVar2 == 0) && (iVar2 = detect_flash(twopass,twopass_frame,(int)lVar5 + 1), iVar2 == 0)
           ) {
          dVar1 = get_prediction_decay_rate(pFVar7);
          dVar1 = dVar1 * local_c8.decay_accumulator;
          dVar12 = 0.01;
          local_c8.decay_accumulator = 0.01;
          if (0.01 <= dVar1) {
            dVar12 = dVar1;
            local_c8.decay_accumulator = dVar1;
          }
        }
        dVar1 = local_c8.decay_accumulator;
        dVar12 = calc_frame_boost(p_rc,frame_info,pFVar7,local_c8.this_frame_mv_in_out,dVar12);
        dVar11 = dVar11 + dVar12 * dVar1;
        if (num_fpstats_used != (int *)0x0) {
          *num_fpstats_used = *num_fpstats_used + 1;
        }
      }
      if (pFVar7 == (FIRSTPASS_STATS *)0x0) break;
      lVar5 = lVar5 + 1;
      lVar8 = lVar8 + 0xe8;
    } while (uVar10 != 0);
    iVar2 = (int)dVar11;
  }
  local_c8.gf_group_skip_pct = 0.0;
  local_c8.gf_group_inactive_zone_rows = 0.0;
  local_c8.gf_group_err = 0.0;
  local_c8.gf_group_raw_error = 0.0;
  local_c8.mv_ratio_accumulator = 0.0;
  local_c8.decay_accumulator = 1.0;
  local_c8.zero_motion_accumulator = 1.0;
  local_c8.loop_decay_rate = 1.0;
  local_c8.last_loop_decay_rate = 1.0;
  local_c8.avg_wavelet_energy = 0.0;
  local_c8.avg_raw_err_stdev = 0.0;
  local_c8.avg_pcnt_second_ref = 0.0;
  local_c8.avg_new_mv_count = 0.0;
  local_c8.abs_mv_in_out_accumulator = 0.0;
  local_c8.avg_sr_coded_error = 0.0;
  local_c8.this_frame_mv_in_out = 0.0;
  local_c8.mv_in_out_accumulator = 0.0;
  local_c8.non_zero_stdev_count = 0;
  if (b_frames < 1) {
    iVar3 = 0;
  }
  else {
    dVar11 = 0.0;
    lVar8 = 0;
    lVar5 = lVar4 * 0xe8;
    do {
      lVar6 = lVar4 + -1 + lVar8;
      if (((lVar6 < 0) ||
          ((FIRSTPASS_STATS *)((long)&twopass_frame->stats_in[-1].frame + lVar5) <
           twopass->stats_buf_ctx->stats_in_end)) &&
         ((-1 < lVar6 ||
          (twopass->stats_buf_ctx->stats_in_start <=
           (FIRSTPASS_STATS *)((long)&twopass_frame->stats_in[-1].frame + lVar5))))) {
        pFVar7 = (FIRSTPASS_STATS *)((long)&twopass_frame->stats_in[-1].frame + lVar5);
      }
      else {
        pFVar7 = (FIRSTPASS_STATS *)0x0;
      }
      if (pFVar7 != (FIRSTPASS_STATS *)0x0) {
        dVar12 = (double)frame_info->frame_height;
        accumulate_frame_motion_stats(pFVar7,&local_c8,(double)frame_info->frame_width,dVar12);
        iVar3 = detect_flash(twopass,twopass_frame,offset + -1 + (int)lVar8);
        if ((iVar3 == 0) &&
           (iVar3 = detect_flash(twopass,twopass_frame,offset + (int)lVar8), iVar3 == 0)) {
          dVar1 = get_prediction_decay_rate(pFVar7);
          dVar1 = dVar1 * local_c8.decay_accumulator;
          dVar12 = 0.01;
          local_c8.decay_accumulator = 0.01;
          if (0.01 <= dVar1) {
            dVar12 = dVar1;
            local_c8.decay_accumulator = dVar1;
          }
        }
        dVar1 = local_c8.decay_accumulator;
        dVar12 = calc_frame_boost(p_rc,frame_info,pFVar7,local_c8.this_frame_mv_in_out,dVar12);
        dVar11 = dVar11 + dVar12 * dVar1;
        if (num_fpstats_used != (int *)0x0) {
          *num_fpstats_used = *num_fpstats_used + 1;
        }
      }
    } while ((pFVar7 != (FIRSTPASS_STATS *)0x0) &&
            (lVar8 = lVar8 + -1, lVar5 = lVar5 + -0xe8, -b_frames < lVar8));
    iVar3 = (int)dVar11;
  }
  iVar3 = iVar3 + iVar2;
  if (project_gfu_boost != 0) {
    iVar9 = b_frames + f_frames;
    *num_fpstats_required = iVar9;
    iVar2 = *num_fpstats_used;
    if (iVar2 < iVar9) {
      dVar11 = (double)p_rc->baseline_gf_interval;
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      dVar12 = (double)iVar9;
      if (dVar12 < 0.0) {
        dVar12 = sqrt(dVar12);
      }
      else {
        dVar12 = SQRT(dVar12);
      }
      if (10.0 <= dVar12) {
        dVar12 = 10.0;
      }
      if (dVar12 <= dVar11) {
        dVar12 = dVar11;
      }
      dVar1 = (double)iVar2;
      if (dVar1 < 0.0) {
        dVar1 = sqrt(dVar1);
      }
      else {
        dVar1 = SQRT(dVar1);
      }
      if (10.0 <= dVar1) {
        dVar1 = 10.0;
      }
      if (dVar1 <= dVar11) {
        dVar1 = dVar11;
      }
      dVar11 = rint(((dVar12 * 10.0 + 200.0) * (double)iVar3) / (dVar1 * 10.0 + 200.0));
      iVar3 = (int)dVar11;
    }
  }
  iVar2 = (b_frames + f_frames) * 0x32;
  if (iVar2 < iVar3) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

int av1_calc_arf_boost(const TWO_PASS *twopass,
                       const TWO_PASS_FRAME *twopass_frame,
                       const PRIMARY_RATE_CONTROL *p_rc, FRAME_INFO *frame_info,
                       int offset, int f_frames, int b_frames,
                       int *num_fpstats_used, int *num_fpstats_required,
                       int project_gfu_boost) {
  int i;
  GF_GROUP_STATS gf_stats;
  init_gf_stats(&gf_stats);
  double boost_score = (double)NORMAL_BOOST;
  int arf_boost;
  int flash_detected = 0;
  if (num_fpstats_used) *num_fpstats_used = 0;

  // Search forward from the proposed arf/next gf position.
  for (i = 0; i < f_frames; ++i) {
    const FIRSTPASS_STATS *this_frame =
        read_frame_stats(twopass, twopass_frame, i + offset);
    if (this_frame == NULL) break;

    // Update the motion related elements to the boost calculation.
    accumulate_frame_motion_stats(this_frame, &gf_stats,
                                  frame_info->frame_width,
                                  frame_info->frame_height);

    // We want to discount the flash frame itself and the recovery
    // frame that follows as both will have poor scores.
    flash_detected = detect_flash(twopass, twopass_frame, i + offset) ||
                     detect_flash(twopass, twopass_frame, i + offset + 1);

    // Accumulate the effect of prediction quality decay.
    if (!flash_detected) {
      gf_stats.decay_accumulator *= get_prediction_decay_rate(this_frame);
      gf_stats.decay_accumulator = gf_stats.decay_accumulator < MIN_DECAY_FACTOR
                                       ? MIN_DECAY_FACTOR
                                       : gf_stats.decay_accumulator;
    }

    boost_score +=
        gf_stats.decay_accumulator *
        calc_frame_boost(p_rc, frame_info, this_frame,
                         gf_stats.this_frame_mv_in_out, GF_MAX_BOOST);
    if (num_fpstats_used) (*num_fpstats_used)++;
  }

  arf_boost = (int)boost_score;

  // Reset for backward looking loop.
  boost_score = 0.0;
  init_gf_stats(&gf_stats);
  // Search backward towards last gf position.
  for (i = -1; i >= -b_frames; --i) {
    const FIRSTPASS_STATS *this_frame =
        read_frame_stats(twopass, twopass_frame, i + offset);
    if (this_frame == NULL) break;

    // Update the motion related elements to the boost calculation.
    accumulate_frame_motion_stats(this_frame, &gf_stats,
                                  frame_info->frame_width,
                                  frame_info->frame_height);

    // We want to discount the the flash frame itself and the recovery
    // frame that follows as both will have poor scores.
    flash_detected = detect_flash(twopass, twopass_frame, i + offset) ||
                     detect_flash(twopass, twopass_frame, i + offset + 1);

    // Cumulative effect of prediction quality decay.
    if (!flash_detected) {
      gf_stats.decay_accumulator *= get_prediction_decay_rate(this_frame);
      gf_stats.decay_accumulator = gf_stats.decay_accumulator < MIN_DECAY_FACTOR
                                       ? MIN_DECAY_FACTOR
                                       : gf_stats.decay_accumulator;
    }

    boost_score +=
        gf_stats.decay_accumulator *
        calc_frame_boost(p_rc, frame_info, this_frame,
                         gf_stats.this_frame_mv_in_out, GF_MAX_BOOST);
    if (num_fpstats_used) (*num_fpstats_used)++;
  }
  arf_boost += (int)boost_score;

  if (project_gfu_boost) {
    assert(num_fpstats_required != NULL);
    assert(num_fpstats_used != NULL);
    *num_fpstats_required = f_frames + b_frames;
    arf_boost = get_projected_gfu_boost(p_rc, arf_boost, *num_fpstats_required,
                                        *num_fpstats_used);
  }

  if (arf_boost < ((b_frames + f_frames) * GF_MIN_BOOST))
    arf_boost = ((b_frames + f_frames) * GF_MIN_BOOST);

  return arf_boost;
}